

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

shared_ptr<Liby::UdpSocket> __thiscall
Liby::EventLoopGroup::creatUdpServer(EventLoopGroup *this,string *host,string *service)

{
  bool bVar1;
  Logger *this_00;
  reference __args_1;
  element_type *this_01;
  shared_ptr<Liby::Socket> *__args_1_00;
  element_type *this_02;
  string *in_RCX;
  int __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int __fd;
  double __x;
  shared_ptr<Liby::UdpSocket> sVar2;
  undefined1 local_60 [8];
  SockPtr sockPtr;
  undefined1 local_40 [8];
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  string *service_local;
  string *host_local;
  EventLoopGroup *this_local;
  shared_ptr<Liby::UdpSocket> *udpSocket;
  
  Resolver::resolve((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40,service,in_RCX
                   );
  bVar1 = std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::empty
                    ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
  if (bVar1) {
    this_00 = Logger::getLogger();
    Logger::log(this_00,__x);
    std::shared_ptr<Liby::UdpSocket>::shared_ptr((shared_ptr<Liby::UdpSocket> *)this,(nullptr_t)0x0)
    ;
    sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1
    ;
  }
  else {
    __args_1 = std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::front
                         ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
    std::make_shared<Liby::Socket,Liby::Endpoint&,bool>((Endpoint *)local_60,(bool *)__args_1);
    __fd = (int)__args_1;
    this_01 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_60);
    Socket::listen(this_01,__fd,__n);
    __args_1_00 = (shared_ptr<Liby::Socket> *)
                  std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::operator[]
                            ((vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_> *)
                             (host + 3),0);
    std::make_shared<Liby::UdpSocket,Liby::EventLoop*&,std::shared_ptr<Liby::Socket>&>
              ((EventLoop **)this,__args_1_00);
    this_02 = std::__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    UdpSocket::start(this_02);
    sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1
    ;
    std::shared_ptr<Liby::Socket>::~shared_ptr((shared_ptr<Liby::Socket> *)local_60);
  }
  std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::~list
            ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)local_40);
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar2.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket>
EventLoopGroup::creatUdpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front(), true);
    sockPtr->listen();

    std::shared_ptr<UdpSocket> udpSocket =
        std::make_shared<UdpSocket>(ploops_[0], sockPtr);
    udpSocket->start();

    return udpSocket;
}